

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O2

bool bssl::uses_disallowed_feature(SSL *ssl)

{
  SSL_CONFIG *pSVar1;
  
  if (((ssl->method->is_dtls == false) &&
      (pSVar1 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl,
      *(long *)((long)(pSVar1->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>
               + 8) == 0)) && ((pSVar1->quic_transport_params).size_ == 0)) {
    return (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)
           *(_Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter> *)
            &(((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ech_keys)._M_t.
             super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter> !=
           (ssl_ech_keys_st *)0x0;
  }
  return true;
}

Assistant:

static bool uses_disallowed_feature(const SSL *ssl) {
  return ssl->method->is_dtls || !ssl->config->cert->credentials.empty() ||
         ssl->config->quic_transport_params.size() > 0 || ssl->ctx->ech_keys;
}